

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabel::setText(QLabel *this,QString *text)

{
  QLabelPrivate *this_00;
  QWidgetTextControl *pQVar1;
  qsizetype qVar2;
  bool bVar3;
  char cVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QArrayDataPointer<char16_t> local_50;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  bVar3 = ::comparesEqual(&this_00->text,text);
  if (!bVar3) {
    pQVar1 = this_00->control;
    this_00->control = (QWidgetTextControl *)0x0;
    QLabelPrivate::clearContents(this_00);
    QString::operator=(&this_00->text,(QString *)text);
    this_00->field_0x340 = this_00->field_0x340 | 0x18;
    if (this_00->textformat == AutoText) {
      QVar5.m_size = (this_00->text).d.size | 0x8000000000000000;
      QVar5.field_0.m_data_utf16 = (this_00->text).d.ptr;
      cVar4 = Qt::mightBeRichText(QVar5);
      if (cVar4 == '\0') {
        this_00->effectiveTextFormat = PlainText;
      }
      else {
        this_00->effectiveTextFormat = RichText;
      }
    }
    else {
      this_00->effectiveTextFormat = this_00->textformat;
    }
    this_00->control = pQVar1;
    bVar3 = QLabelPrivate::needTextControl(this_00);
    if (bVar3) {
      QLabelPrivate::ensureTextControl(this_00);
    }
    else {
      if (this_00->control != (QWidgetTextControl *)0x0) {
        (**(code **)(*(long *)this_00->control + 0x20))();
      }
      this_00->control = (QWidgetTextControl *)0x0;
    }
    if (this_00->effectiveTextFormat != PlainText) {
      QWidget::setMouseTracking((QWidget *)this,true);
    }
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this_00->buddy);
    if (bVar3) {
      QLabelPrivate::updateShortcut(this_00);
    }
    QLabelPrivate::updateLabel(this_00);
    QWidget::accessibleName((QString *)&local_50,(QWidget *)this);
    qVar2 = local_50.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if ((QLabel *)qVar2 == (QLabel *)0x0) {
      local_50.d = (Data *)QFont::strikeOut;
      local_50.ptr = (char16_t *)0xaaaaaaaa0000800c;
      local_38 = 0xaaaaaaaaffffffff;
      local_50.size = (qsizetype)this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setText(const QString &text)
{
    Q_D(QLabel);
    if (d->text == text)
        return;

    QWidgetTextControl *oldControl = d->control;
    d->control = nullptr;

    d->clearContents();
    d->text = text;
    d->isTextLabel = true;
    d->textDirty = true;
    if (d->textformat == Qt::AutoText) {
        if (Qt::mightBeRichText(d->text))
            d->effectiveTextFormat = Qt::RichText;
        else
            d->effectiveTextFormat = Qt::PlainText;
    } else {
        d->effectiveTextFormat = d->textformat;
    }

    d->control = oldControl;

    if (d->needTextControl()) {
        d->ensureTextControl();
    } else {
        delete d->control;
        d->control = nullptr;
    }

    if (d->effectiveTextFormat != Qt::PlainText) {
        setMouseTracking(true);
    } else {
        // Note: mouse tracking not disabled intentionally
    }

#ifndef QT_NO_SHORTCUT
    if (d->buddy)
        d->updateShortcut();
#endif

    d->updateLabel();

#if QT_CONFIG(accessibility)
    if (accessibleName().isEmpty()) {
        QAccessibleEvent event(this, QAccessible::NameChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif
}